

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O1

bool __thiscall Subprocess::Start(Subprocess *this,SubprocessSet *set,string *command)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  short __flags;
  char *msg;
  int output_pipe [2];
  posix_spawn_file_actions_t action;
  char *spawned_args [4];
  posix_spawnattr_t attr;
  int local_1e0;
  int local_1dc;
  posix_spawn_file_actions_t local_1d8;
  char *local_188;
  char *local_180;
  pointer local_178;
  undefined8 local_170;
  posix_spawnattr_t local_168;
  
  iVar1 = pipe(&local_1e0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  }
  else {
    this->fd_ = local_1e0;
    if (local_1e0 < 0x400) {
      SetCloseOnExec(local_1e0);
      iVar1 = posix_spawn_file_actions_init(&local_1d8);
      if (iVar1 != 0) {
        pcVar3 = strerror(iVar1);
        msg = "posix_spawn_file_actions_init: %s";
        goto LAB_00123af4;
      }
      iVar1 = posix_spawn_file_actions_addclose(&local_1d8,local_1e0);
      if (iVar1 != 0) {
LAB_00123a34:
        pcVar3 = strerror(iVar1);
        msg = "posix_spawn_file_actions_addclose: %s";
        goto LAB_00123af4;
      }
      iVar1 = posix_spawnattr_init(&local_168);
      if (iVar1 != 0) {
        pcVar3 = strerror(iVar1);
        msg = "posix_spawnattr_init: %s";
        goto LAB_00123af4;
      }
      iVar1 = posix_spawnattr_setsigmask(&local_168,(sigset_t *)&set->old_mask_);
      if (iVar1 != 0) {
        pcVar3 = strerror(iVar1);
        msg = "posix_spawnattr_setsigmask: %s";
        goto LAB_00123af4;
      }
      __flags = 0x48;
      if (this->use_console_ == false) {
        iVar1 = posix_spawn_file_actions_addopen(&local_1d8,0,"/dev/null",0,0);
        if (iVar1 != 0) {
          pcVar3 = strerror(iVar1);
          msg = "posix_spawn_file_actions_addopen: %s";
          goto LAB_00123af4;
        }
        iVar1 = posix_spawn_file_actions_adddup2(&local_1d8,local_1dc,1);
        if (iVar1 == 0) {
          iVar1 = posix_spawn_file_actions_adddup2(&local_1d8,local_1dc,2);
          if (iVar1 == 0) {
            iVar1 = posix_spawn_file_actions_addclose(&local_1d8,local_1dc);
            __flags = 0x4a;
            if (iVar1 != 0) goto LAB_00123a34;
            goto LAB_00123989;
          }
        }
        pcVar3 = strerror(iVar1);
        msg = "posix_spawn_file_actions_adddup2: %s";
      }
      else {
LAB_00123989:
        iVar1 = posix_spawnattr_setflags(&local_168,__flags);
        if (iVar1 == 0) {
          local_188 = "/bin/sh";
          local_180 = "-c";
          local_178 = (command->_M_dataplus)._M_p;
          local_170 = 0;
          iVar1 = posix_spawn(&this->pid_,"/bin/sh",&local_1d8,&local_168,&local_188,_environ);
          if (iVar1 == 0) {
            iVar1 = posix_spawnattr_destroy(&local_168);
            if (iVar1 == 0) {
              iVar1 = posix_spawn_file_actions_destroy(&local_1d8);
              if (iVar1 == 0) {
                close(local_1dc);
                return true;
              }
              pcVar3 = strerror(iVar1);
              msg = "posix_spawn_file_actions_destroy: %s";
            }
            else {
              pcVar3 = strerror(iVar1);
              msg = "posix_spawnattr_destroy: %s";
            }
          }
          else {
            pcVar3 = strerror(iVar1);
            msg = "posix_spawn: %s";
          }
        }
        else {
          pcVar3 = strerror(iVar1);
          msg = "posix_spawnattr_setflags: %s";
        }
      }
      goto LAB_00123af4;
    }
    iVar1 = 0x18;
  }
  pcVar3 = strerror(iVar1);
  msg = "pipe: %s";
LAB_00123af4:
  Fatal(msg,pcVar3);
}

Assistant:

bool Subprocess::Start(SubprocessSet* set, const string& command) {
  int output_pipe[2];
  if (pipe(output_pipe) < 0)
    Fatal("pipe: %s", strerror(errno));
  fd_ = output_pipe[0];
#if !defined(USE_PPOLL)
  // If available, we use ppoll in DoWork(); otherwise we use pselect
  // and so must avoid overly-large FDs.
  if (fd_ >= static_cast<int>(FD_SETSIZE))
    Fatal("pipe: %s", strerror(EMFILE));
#endif  // !USE_PPOLL
  SetCloseOnExec(fd_);

  posix_spawn_file_actions_t action;
  int err = posix_spawn_file_actions_init(&action);
  if (err != 0)
    Fatal("posix_spawn_file_actions_init: %s", strerror(err));

  err = posix_spawn_file_actions_addclose(&action, output_pipe[0]);
  if (err != 0)
    Fatal("posix_spawn_file_actions_addclose: %s", strerror(err));

  posix_spawnattr_t attr;
  err = posix_spawnattr_init(&attr);
  if (err != 0)
    Fatal("posix_spawnattr_init: %s", strerror(err));

  short flags = 0;

  flags |= POSIX_SPAWN_SETSIGMASK;
  err = posix_spawnattr_setsigmask(&attr, &set->old_mask_);
  if (err != 0)
    Fatal("posix_spawnattr_setsigmask: %s", strerror(err));
  // Signals which are set to be caught in the calling process image are set to
  // default action in the new process image, so no explicit
  // POSIX_SPAWN_SETSIGDEF parameter is needed.

  if (!use_console_) {
    // Put the child in its own process group, so ctrl-c won't reach it.
    flags |= POSIX_SPAWN_SETPGROUP;
    // No need to posix_spawnattr_setpgroup(&attr, 0), it's the default.

    // Open /dev/null over stdin.
    err = posix_spawn_file_actions_addopen(&action, 0, "/dev/null", O_RDONLY,
          0);
    if (err != 0) {
      Fatal("posix_spawn_file_actions_addopen: %s", strerror(err));
    }

    err = posix_spawn_file_actions_adddup2(&action, output_pipe[1], 1);
    if (err != 0)
      Fatal("posix_spawn_file_actions_adddup2: %s", strerror(err));
    err = posix_spawn_file_actions_adddup2(&action, output_pipe[1], 2);
    if (err != 0)
      Fatal("posix_spawn_file_actions_adddup2: %s", strerror(err));
    err = posix_spawn_file_actions_addclose(&action, output_pipe[1]);
    if (err != 0)
      Fatal("posix_spawn_file_actions_addclose: %s", strerror(err));
    // In the console case, output_pipe is still inherited by the child and
    // closed when the subprocess finishes, which then notifies ninja.
  }
#ifdef POSIX_SPAWN_USEVFORK
  flags |= POSIX_SPAWN_USEVFORK;
#endif

  err = posix_spawnattr_setflags(&attr, flags);
  if (err != 0)
    Fatal("posix_spawnattr_setflags: %s", strerror(err));

  const char* spawned_args[] = { "/bin/sh", "-c", command.c_str(), NULL };
  err = posix_spawn(&pid_, "/bin/sh", &action, &attr,
        const_cast<char**>(spawned_args), environ);
  if (err != 0)
    Fatal("posix_spawn: %s", strerror(err));

  err = posix_spawnattr_destroy(&attr);
  if (err != 0)
    Fatal("posix_spawnattr_destroy: %s", strerror(err));
  err = posix_spawn_file_actions_destroy(&action);
  if (err != 0)
    Fatal("posix_spawn_file_actions_destroy: %s", strerror(err));

  close(output_pipe[1]);
  return true;
}